

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O2

void Qentem::Test::TestVariableUTag3(QTest *test)

{
  uint uVar1;
  StringStream<char16_t> *pSVar2;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  Value<char16_t> local_70;
  StringStream<char16_t> local_58;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_48;
  undefined1 local_38;
  
  local_58.storage_ = (char16_t *)0x0;
  local_58.length_ = 0;
  local_58.capacity_ = 0;
  local_48.array_.storage_ = (Value<char16_t> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11cecc,0x159);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:a}",0x15c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0[0]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0]}",uVar1,(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[0]}",0x160);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:a[0]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a[0]}",uVar1,(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:a[0]}",0x164);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0[a]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[a]}",uVar1,(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[a]}",0x168);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:a[abc]}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:a[abc]}",uVar1,(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[13]>
            (test,pSVar2,(char16_t (*) [13])L"{var:a[abc]}",0x16c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&local_70,L"[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]");
  Value<char16_t>::operator=((Value<char16_t> *)&local_48.array_,&local_70);
  Value<char16_t>::~Value(&local_70);
  uVar1 = StringUtils::Count<char16_t,unsigned_int>(L"{var:0}");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0}",uVar1,(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11cecc,0x174);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0]}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:0[0]}",0x178);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0[0][0]}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[14]>
            (test,pSVar2,(char16_t (*) [14])L"{var:0[0][0]}",0x17c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:1}",0x182);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:2}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11c9ce,0x186);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1[a]}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:1[a]}",0x18a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1[b]}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar2,(char16_t (*) [11])L"{var:1[b]}",0x18e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&local_70,L"[\"A\", \"abc\", true, 456, 1.5]");
  Value<char16_t>::operator=((Value<char16_t> *)&local_48.array_,&local_70);
  Value<char16_t>::~Value(&local_70);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x11d558,0x196);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x11cece,0x19a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{v}",0x19e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{va}",0x1a2);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{var}",0x1a6);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{var:}",0x1aa);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{v:0}",0x1ae);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{va:0}",0x1b2);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:0A",0x1b8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x11d1ba,0x1bc);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"var:0}A",0x1c0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L"{var:0AA",0x1c4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var:1A",0x1ca);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:1{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x11d232,0x1ce);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"var:1}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"var:1}A",0x1d2);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:1{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L"{var:1AA",0x1d6);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"{A",0x1dc);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{AA",0x1e0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{vA",0x1e4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{vAA",0x1e8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{vaA",0x1ec);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{vaAA",0x1f0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{varA",500);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{varAA",0x1f8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{-{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"{-A",0x1fe);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{-{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{-AA",0x202);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v-{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"{v-A",0x206);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{v-{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{v-AA",0x20a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va-{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"{va-A",0x20e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{va-{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{va-AA",0x212);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"{var-A",0x216);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-{var:0}{var:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"{var-AA",0x21a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var-0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11d50e,0x220);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var 0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11d520,0x224);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0 }",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])0x11d532,0x228);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0 ",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])0x11d546,0x22c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{var:0",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])0x11d558,0x230);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var-0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var-0}",0x234);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var 0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var 0}",0x238);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0 }",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[10]>
            (test,pSVar2,(char16_t (*) [10])L" {var:0 }",0x23c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0 ",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar2,(char16_t (*) [9])L" {var:0 ",0x240);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L" {var:0",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L" {var:0",0x244);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_48.array_);
  Memory::Deallocate(local_58.storage_);
  return;
}

Assistant:

static void TestVariableUTag3(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({var:a})", value, ss), uR"({var:a})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(uR"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = uR"({var:1})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1})", __LINE__);
    ss.Clear();

    content = uR"({var:2})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:2})", __LINE__);
    ss.Clear();

    content = uR"({var:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(uR"(["A", "abc", true, 456, 1.5])");

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"(var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0})", __LINE__);
    ss.Clear();

    content = uR"({v})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v})", __LINE__);
    ss.Clear();

    content = uR"({va})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va})", __LINE__);
    ss.Clear();

    content = uR"({var})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var})", __LINE__);
    ss.Clear();

    content = uR"({var:})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:})", __LINE__);
    ss.Clear();

    content = uR"({v:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v:0})", __LINE__);
    ss.Clear();

    content = uR"({va:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va:0})", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0}A)", __LINE__);
    ss.Clear();

    content = uR"({var:0{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1}A)", __LINE__);
    ss.Clear();

    content = uR"({var:1{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({A)", __LINE__);
    ss.Clear();

    content = uR"({{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({AA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vAA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaAA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varAA)", __LINE__);
    ss.Clear();

    ///

    content = uR"({-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-A)", __LINE__);
    ss.Clear();

    content = uR"({-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-AA)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-A)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-AA)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-A)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-AA)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-A)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-AA)", __LINE__);
    ss.Clear();

    //

    content = uR"({var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-0})", __LINE__);
    ss.Clear();

    content = uR"({var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var 0})", __LINE__);
    ss.Clear();

    content = uR"({var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 })", __LINE__);
    ss.Clear();

    content = uR"({var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 )", __LINE__);
    ss.Clear();

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"( {var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var-0})", __LINE__);
    ss.Clear();

    content = uR"( {var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var 0})", __LINE__);
    ss.Clear();

    content = uR"( {var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 })", __LINE__);
    ss.Clear();

    content = uR"( {var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 )", __LINE__);
    ss.Clear();

    content = uR"( {var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0)", __LINE__);
    ss.Clear();
}